

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limit_relation.cpp
# Opt level: O1

string * __thiscall
duckdb::LimitRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,LimitRelation *this,idx_t depth)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  long *plVar6;
  undefined8 *puVar7;
  Relation *pRVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  size_type *psVar12;
  uint uVar13;
  ulong uVar14;
  string str;
  string __str;
  string __str_1;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  undefined8 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  idx_t local_58;
  string local_50;
  
  Relation::RenderWhitespace_abi_cxx11_(&local_50,(Relation *)depth,depth);
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_50);
  local_b8 = &local_a8;
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_a8 = *puVar9;
    lStack_a0 = plVar6[3];
  }
  else {
    local_a8 = *puVar9;
    local_b8 = (ulong *)*plVar6;
  }
  local_b0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar14 = this->limit;
  uVar11 = -uVar14;
  if (0 < (long)uVar14) {
    uVar11 = uVar14;
  }
  uVar13 = 1;
  if (9 < uVar11) {
    uVar10 = uVar11;
    uVar5 = 4;
    do {
      uVar13 = uVar5;
      if (uVar10 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0174db48;
      }
      if (uVar10 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0174db48;
      }
      if (uVar10 < 10000) goto LAB_0174db48;
      bVar3 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      uVar5 = uVar13 + 4;
    } while (bVar3);
    uVar13 = uVar13 + 1;
  }
LAB_0174db48:
  local_78 = local_68;
  local_58 = depth;
  ::std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar13 - (char)((long)uVar14 >> 0x3f))
  ;
  ::std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)local_78 - ((long)uVar14 >> 0x3f)),uVar13,uVar11);
  uVar14 = 0xf;
  if (local_b8 != &local_a8) {
    uVar14 = local_a8;
  }
  if (uVar14 < (ulong)(local_70 + local_b0)) {
    uVar14 = 0xf;
    if (local_78 != local_68) {
      uVar14 = local_68[0];
    }
    if ((ulong)(local_70 + local_b0) <= uVar14) {
      puVar7 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_b8);
      goto LAB_0174dbd9;
    }
  }
  puVar7 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_78);
LAB_0174dbd9:
  local_98 = &local_88;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_88 = *puVar1;
    uStack_80 = puVar7[3];
  }
  else {
    local_88 = *puVar1;
    local_98 = (undefined8 *)*puVar7;
  }
  local_90 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  paVar2 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  uVar14 = this->offset;
  if (0 < (long)uVar14) {
    uVar13 = 1;
    if (9 < uVar14) {
      uVar11 = uVar14;
      uVar5 = 4;
      do {
        uVar13 = uVar5;
        if (uVar11 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_0174dcb7;
        }
        if (uVar11 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_0174dcb7;
        }
        if (uVar11 < 10000) goto LAB_0174dcb7;
        bVar3 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        uVar5 = uVar13 + 4;
      } while (bVar3);
      uVar13 = uVar13 + 1;
    }
LAB_0174dcb7:
    local_50._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar13);
    ::std::__detail::__to_chars_10_impl<unsigned_long>(local_50._M_dataplus._M_p,uVar13,uVar14);
    puVar7 = (undefined8 *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1e4c864)
    ;
    puVar9 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar9) {
      local_a8 = *puVar9;
      lStack_a0 = puVar7[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *puVar9;
      local_b8 = (ulong *)*puVar7;
    }
    local_b0 = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  ::std::__cxx11::string::append((char *)&local_98);
  pRVar8 = shared_ptr<duckdb::Relation,_true>::operator->(&this->child);
  (*pRVar8->_vptr_Relation[6])(&local_b8,pRVar8,local_58 + 1);
  plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar12 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar12) {
    lVar4 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

string LimitRelation::ToString(idx_t depth) {
	string str = RenderWhitespace(depth) + "Limit " + to_string(limit);
	if (offset > 0) {
		str += " Offset " + to_string(offset);
	}
	str += "\n";
	return str + child->ToString(depth + 1);
}